

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_duplicate_set.c
# Opt level: O1

void oonf_duplicate_set_add(oonf_duplicate_set *set,oonf_dupset_type type)

{
  long lVar1;
  
  set->_limit = 0;
  set->_offset = 0;
  (set->_tree).comp = (_func_int_void_ptr_void_ptr *)0x0;
  set->_mask = 0;
  (set->_tree).root = (avl_node *)0x0;
  (set->_tree).count = 0;
  (set->_tree).allow_dups = false;
  *(undefined3 *)&(set->_tree).field_0x1d = 0;
  (set->_tree).list_head.next = (list_entity *)0x0;
  (set->_tree).list_head.prev = (list_entity *)0x0;
  avl_init(set,_avl_cmp_dupkey,0);
  if (type != OONF_DUPSET_64BIT) {
    lVar1 = _mask_values[type];
    set->_mask = lVar1;
    set->_offset = lVar1 + 1;
    set->_limit = lVar1 / 2;
  }
  return;
}

Assistant:

void
oonf_duplicate_set_add(struct oonf_duplicate_set *set, enum oonf_dupset_type type) {
  memset(set, 0, sizeof(*set));
  avl_init(&set->_tree, _avl_cmp_dupkey, false);

  if (type != OONF_DUPSET_64BIT) {
    set->_mask = _mask_values[type];
    set->_offset = set->_mask + 1;
    set->_limit = set->_mask / 2;
  }
}